

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::BrepFaceField<3L>,_std::shared_ptr<anurbs::BrepFaceField<3L>_>_> * __thiscall
pybind11::class_<anurbs::BrepFaceField<3l>,std::shared_ptr<anurbs::BrepFaceField<3l>>>::
def<void(anurbs::BrepFaceField<3l>::*)(long,Eigen::Matrix<double,1,3,1,1,3>const&),pybind11::arg,pybind11::arg>
          (class_<anurbs::BrepFaceField<3l>,std::shared_ptr<anurbs::BrepFaceField<3l>>> *this,
          char *name_,offset_in_Model_to_subr *f,arg *extra,arg *extra_1)

{
  offset_in_Model_to_subr f_00;
  name *extra_00;
  handle local_d0;
  PyObject *local_c8;
  obj_attr_accessor local_c0;
  offset_in_Model_to_subr local_a0;
  handle local_80;
  PyObject *local_78;
  handle local_70;
  handle local_68;
  undefined1 local_60 [16];
  is_method local_50;
  void *local_48;
  offset_in_Model_to_subr local_40;
  cpp_function local_38;
  cpp_function cf;
  arg *extra_local_1;
  arg *extra_local;
  offset_in_Model_to_subr *f_local;
  char *name__local;
  class_<anurbs::BrepFaceField<3L>,_std::shared_ptr<anurbs::BrepFaceField<3L>_>_> *this_local;
  
  local_48 = (void *)*f;
  local_40 = f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra_1;
  f_00 = _anurbs__BrepFaceField<3l>___pybind11__method_adaptor<anurbs::BrepFaceField<3l>,void,anurbs::BrepFaceField<3l>,long,Eigen::Matrix<double,1,3,1,1,3>const&>_void_anurbs__BrepFaceField<3l>_____long_Eigen__Matrix<double,1,3,1,1,3>const____
                   (local_48,local_40);
  pybind11::name::name((name *)&local_50,name_);
  is_method::is_method((is_method *)(local_60 + 8),(handle *)this);
  local_70.m_ptr = *(PyObject **)this;
  none::none((none *)&local_80);
  local_78 = local_80.m_ptr;
  getattr((pybind11 *)&local_68,local_70,name_,local_80);
  sibling::sibling((sibling *)local_60,&local_68);
  local_a0 = f_00;
  cpp_function::
  cpp_function<void,anurbs::BrepFaceField<3l>,long,Eigen::Matrix<double,1,3,1,1,3>const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&local_38,f_00,extra_00,&local_50,(sibling *)(local_60 + 8),(arg *)local_60,extra);
  pybind11::object::~object((object *)&local_68);
  none::~none((none *)&local_80);
  cpp_function::name((cpp_function *)&local_d0);
  local_c8 = local_d0.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_c0,(object_api<pybind11::handle> *)this,local_d0);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_c0,&local_38);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_c0);
  pybind11::object::~object((object *)&local_d0);
  cpp_function::~cpp_function(&local_38);
  return (class_<anurbs::BrepFaceField<3L>,_std::shared_ptr<anurbs::BrepFaceField<3L>_>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }